

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O2

Node * __thiscall State::GetNode(State *this,StringPiece path,uint64_t slash_bits)

{
  Node *this_00;
  mapped_type *ppNVar1;
  StringPiece path_local;
  string local_38;
  
  path_local.len_ = path.len_;
  path_local.str_ = path.str_;
  this_00 = LookupNode(this,path);
  if (this_00 == (Node *)0x0) {
    this_00 = (Node *)operator_new(0x60);
    StringPiece::AsString_abi_cxx11_(&local_38,&path_local);
    Node::Node(this_00,&local_38,slash_bits);
    std::__cxx11::string::~string((string *)&local_38);
    local_38._M_dataplus._M_p = (this_00->path_)._M_dataplus._M_p;
    local_38._M_string_length = (this_00->path_)._M_string_length;
    ppNVar1 = std::__detail::
              _Map_base<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this,(key_type *)&local_38);
    *ppNVar1 = this_00;
  }
  return this_00;
}

Assistant:

Node* State::GetNode(StringPiece path, uint64_t slash_bits) {
  Node* node = LookupNode(path);
  if (node)
    return node;
  node = new Node(path.AsString(), slash_bits);
  paths_[node->path()] = node;
  return node;
}